

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedHybridMeshControl.cpp
# Opt level: O2

void __thiscall
TPZMHMixedHybridMeshControl::AdjustBoundaryConditionsOfFractures(TPZMHMixedHybridMeshControl *this)

{
  int iVar1;
  TPZGeoMesh *pTVar2;
  int iVar3;
  TPZGeoEl *gel;
  long lVar4;
  long iel;
  
  TPZGeoMesh::ResetReference
            (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer);
  TPZCompMesh::LoadReferences(((this->super_TPZMHMixedMeshControl).fFluxMesh.fRef)->fPointer);
  pTVar2 = ((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer;
  iVar1 = pTVar2->fDim;
  lVar4 = (pTVar2->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  iel = 0;
  if (lVar4 < 1) {
    lVar4 = iel;
  }
  for (; lVar4 != iel; iel = iel + 1) {
    gel = TPZGeoMesh::Element(((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.
                              fRef)->fPointer,iel);
    if (gel != (TPZGeoEl *)0x0) {
      iVar3 = (**(code **)(*(long *)gel + 0x210))(gel);
      if ((iVar3 == iVar1 + -2) &&
         (gel->fMatId ==
          (this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fBoundaryWrapMatId)) {
        ApplyNeighbourBoundaryCondition(this,gel);
      }
    }
  }
  return;
}

Assistant:

void TPZMHMixedHybridMeshControl::AdjustBoundaryConditionsOfFractures()
{
    fGMesh->ResetReference();
    fFluxMesh->LoadReferences();
    int meshdim = fGMesh->Dimension();
    int64_t nel = fGMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if(gel && gel->Dimension() == meshdim-2 && gel->MaterialId() == fBoundaryWrapMatId)
        {
            ApplyNeighbourBoundaryCondition(gel);
        }
    }
}